

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_pubsub_is_attached(fio_pubsub_engine_s *engine)

{
  fio_pubsub_engine_s *pfVar1;
  fio_pubsub_engine_s *addr;
  fio_pubsub_engine_s *engine_local;
  
  fio_lock(&fio_postoffice.engines.lock);
  pfVar1 = fio_engine_set_find(&fio_postoffice.engines.set,(uintptr_t)engine,engine);
  fio_unlock(&fio_postoffice.engines.lock);
  return (int)(pfVar1 != (fio_pubsub_engine_s *)0x0);
}

Assistant:

int fio_pubsub_is_attached(fio_pubsub_engine_s *engine) {
  fio_pubsub_engine_s *addr;
  fio_lock(&fio_postoffice.engines.lock);
  addr = fio_engine_set_find(&fio_postoffice.engines.set, (uintptr_t)engine,
                             engine);
  fio_unlock(&fio_postoffice.engines.lock);
  return addr != NULL;
}